

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quicly.c
# Opt level: O2

int send_ack(quicly_conn_t *conn,st_quicly_pn_space_t *space,quicly_send_context_t *s)

{
  uint64_t *puVar1;
  int iVar2;
  uint8_t *puVar3;
  quicly_sent_t *pqVar4;
  uint64_t uVar5;
  long lVar6;
  size_t sVar7;
  
  if ((space->ack_queue).num_ranges != 0) {
    lVar6 = (conn->stash).now;
    uVar5 = (lVar6 - space->largest_pn_received_at) * 1000 >> 10;
    if (lVar6 <= space->largest_pn_received_at) {
      uVar5 = 0;
    }
    while( true ) {
      iVar2 = allocate_frame(conn,s,0x12);
      if (iVar2 != 0) {
        return iVar2;
      }
      puVar3 = quicly_encode_ack_frame(s->dst,s->dst_end,&space->ack_queue,uVar5);
      if (puVar3 != (uint8_t *)0x0) break;
      puVar3 = s->dst;
      if (puVar3 == s->dst_payload_from) {
        if ((s->target).first_byte_at == (s->payload_buf).datagram) {
          __assert_fail("s->target.first_byte_at != s->payload_buf.datagram",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/lib/quicly.c"
                        ,0xcbc,
                        "int send_ack(quicly_conn_t *, struct st_quicly_pn_space_t *, quicly_send_context_t *)"
                       );
        }
        s->dst = puVar3 + 1;
        *puVar3 = '\0';
      }
      iVar2 = commit_send_packet(conn,s,QUICLY_COMMIT_SEND_PACKET_MODE_FULL_SIZE);
      if (iVar2 != 0) {
        return iVar2;
      }
    }
    puVar1 = &(conn->super).stats.num_frames_sent.ack;
    *puVar1 = *puVar1 + 1;
    if ((quicly_trace_fp != (FILE *)0x0) &&
       (iVar2 = ptls_skip_tracing((conn->crypto).tls), iVar2 == 0)) {
      fprintf((FILE *)quicly_trace_fp,
              "{\"type\":\"ack-send\", \"conn\":%u, \"time\":%lld, \"largest-acked\":%llu, \"ack-delay\":%llu}\n"
              ,(ulong)(conn->super).local.cid_set.plaintext.master_id,(conn->stash).now,
              (space->ack_queue).ranges[(space->ack_queue).num_ranges - 1].end - 1,uVar5);
    }
    if (((7 < (space->ack_queue).num_ranges) && (((conn->egress).packet_number & 3) == 0)) &&
       (puVar3 < s->dst_end)) {
      *puVar3 = '\x01';
      puVar1 = &(conn->super).stats.num_frames_sent.ping;
      *puVar1 = *puVar1 + 1;
      puVar3 = puVar3 + 1;
      if ((quicly_trace_fp != (FILE *)0x0) &&
         (iVar2 = ptls_skip_tracing((conn->crypto).tls), iVar2 == 0)) {
        QUICLY_PING_SEND(conn,(conn->stash).now);
      }
    }
    s->dst = puVar3;
    lVar6 = 0;
    for (sVar7 = 0; sVar7 != (space->ack_queue).num_ranges; sVar7 = sVar7 + 1) {
      pqVar4 = quicly_sentmap_allocate(&(conn->egress).loss.sentmap,on_ack_ack);
      if (pqVar4 == (quicly_sent_t *)0x0) {
        return 0x201;
      }
      puVar1 = (uint64_t *)((long)&((space->ack_queue).ranges)->start + lVar6);
      uVar5 = puVar1[1];
      (pqVar4->data).packet.packet_number = *puVar1;
      (pqVar4->data).packet.sent_at = uVar5;
      lVar6 = lVar6 + 0x10;
    }
    space->unacked_count = 0;
  }
  return 0;
}

Assistant:

static int send_ack(quicly_conn_t *conn, struct st_quicly_pn_space_t *space, quicly_send_context_t *s)
{
    uint64_t ack_delay;
    int ret;

    if (space->ack_queue.num_ranges == 0)
        return 0;

    /* calc ack_delay */
    if (space->largest_pn_received_at < conn->stash.now) {
        /* We underreport ack_delay up to 1 milliseconds assuming that QUICLY_LOCAL_ACK_DELAY_EXPONENT is 10. It's considered a
         * non-issue because our time measurement is at millisecond granurality anyways. */
        ack_delay = ((conn->stash.now - space->largest_pn_received_at) * 1000) >> QUICLY_LOCAL_ACK_DELAY_EXPONENT;
    } else {
        ack_delay = 0;
    }

Emit: /* emit an ACK frame */
    if ((ret = allocate_frame(conn, s, QUICLY_ACK_FRAME_CAPACITY)) != 0)
        return ret;
    uint8_t *dst = s->dst;
    dst = quicly_encode_ack_frame(dst, s->dst_end, &space->ack_queue, ack_delay);

    /* when there's no space, retry with a new MTU-sized packet */
    if (dst == NULL) {
        /* [rare case] A coalesced packet might not have enough space to hold only an ACK. If so, pad it, as that's easier than
         * rolling back. */
        if (s->dst == s->dst_payload_from) {
            assert(s->target.first_byte_at != s->payload_buf.datagram);
            *s->dst++ = QUICLY_FRAME_TYPE_PADDING;
        }
        if ((ret = commit_send_packet(conn, s, QUICLY_COMMIT_SEND_PACKET_MODE_FULL_SIZE)) != 0)
            return ret;
        goto Emit;
    }

    ++conn->super.stats.num_frames_sent.ack;
    QUICLY_PROBE(ACK_SEND, conn, conn->stash.now, space->ack_queue.ranges[space->ack_queue.num_ranges - 1].end - 1, ack_delay);

    /* when there are no less than QUICLY_NUM_ACK_BLOCKS_TO_INDUCE_ACKACK (8) gaps, bundle PING once every 4 packets being sent */
    if (space->ack_queue.num_ranges >= QUICLY_NUM_ACK_BLOCKS_TO_INDUCE_ACKACK && conn->egress.packet_number % 4 == 0 &&
        dst < s->dst_end) {
        *dst++ = QUICLY_FRAME_TYPE_PING;
        ++conn->super.stats.num_frames_sent.ping;
        QUICLY_PROBE(PING_SEND, conn, conn->stash.now);
    }

    s->dst = dst;

    { /* save what's inflight */
        size_t i;
        for (i = 0; i != space->ack_queue.num_ranges; ++i) {
            quicly_sent_t *sent;
            if ((sent = quicly_sentmap_allocate(&conn->egress.loss.sentmap, on_ack_ack)) == NULL)
                return PTLS_ERROR_NO_MEMORY;
            sent->data.ack.range = space->ack_queue.ranges[i];
        }
    }

    space->unacked_count = 0;

    return ret;
}